

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  bool bVar1;
  string *psVar2;
  int iVar3;
  PathArgument *pPVar4;
  long lVar5;
  char *pcVar6;
  undefined1 *puVar7;
  string *in_RSI;
  PathArgument *in_RDI;
  char *beginName;
  ArrayIndex index;
  const_iterator itInArg;
  char *end;
  char *current;
  undefined4 in_stack_fffffffffffffed8;
  ArrayIndex in_stack_fffffffffffffedc;
  PathArgument *in_stack_fffffffffffffee0;
  PathArgument *in_stack_fffffffffffffef0;
  Kind kind;
  const_iterator *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff07;
  string *in_stack_ffffffffffffff08;
  PathArgument *in_stack_ffffffffffffff10;
  undefined8 local_c1;
  PathArgument *local_78;
  int local_34;
  PathArgument **local_30;
  PathArgument *local_28;
  PathArgument *local_20;
  string *local_10;
  
  local_10 = in_RSI;
  pPVar4 = (PathArgument *)std::__cxx11::string::c_str();
  local_20 = pPVar4;
  lVar5 = std::__cxx11::string::length();
  local_28 = (PathArgument *)(&(pPVar4->key_)._M_dataplus + lVar5);
  local_30 = (PathArgument **)
             std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::
             begin((vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                    *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  while (local_20 != local_28) {
    kind = (Kind)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    if ((local_20->key_)._M_dataplus == (_Alloc_hider)0x5b) {
      local_20 = (PathArgument *)&(local_20->key_).field_0x1;
      if (*(char *)local_20 == '%') {
        addPathInArg((Path *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (InArgs *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffef8,kind);
      }
      else {
        local_34 = 0;
        while( true ) {
          bVar1 = false;
          if ((local_20 != local_28) && (bVar1 = false, '/' < (char)(local_20->key_)._M_dataplus)) {
            bVar1 = (char)(local_20->key_)._M_dataplus < ':';
          }
          if (!bVar1) break;
          local_34 = local_34 * 10 + (char)(local_20->key_)._M_dataplus + -0x30;
          local_20 = (PathArgument *)&(local_20->key_).field_0x1;
        }
        PathArgument::PathArgument(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                  ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)
                   in_stack_fffffffffffffee0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        PathArgument::~PathArgument((PathArgument *)0x1879a5);
      }
      if ((local_20 == local_28) ||
         (puVar7 = &(local_20->key_).field_0x1, psVar2 = &local_20->key_,
         local_20 = (PathArgument *)puVar7, psVar2->_M_dataplus != (_Alloc_hider)0x5d)) {
        in_stack_ffffffffffffff08 = local_10;
        in_stack_ffffffffffffff10 = local_20;
        iVar3 = std::__cxx11::string::c_str();
        invalidPath((Path *)in_RDI,in_stack_ffffffffffffff08,(int)in_stack_ffffffffffffff10 - iVar3)
        ;
      }
    }
    else if ((local_20->key_)._M_dataplus == (_Alloc_hider)0x25) {
      addPathInArg((Path *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                   (InArgs *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,kind);
      local_20 = (PathArgument *)&(local_20->key_).field_0x1;
    }
    else if ((local_20->key_)._M_dataplus == (_Alloc_hider)0x2e) {
      local_20 = (PathArgument *)&(local_20->key_).field_0x1;
    }
    else {
      local_78 = local_20;
      while( true ) {
        in_stack_ffffffffffffff07 = 0;
        if (local_20 != local_28) {
          pcVar6 = strchr("[.",(int)(char)(local_20->key_)._M_dataplus);
          in_stack_ffffffffffffff07 = pcVar6 != (char *)0x0 ^ 0xff;
        }
        if ((in_stack_ffffffffffffff07 & 1) == 0) break;
        local_20 = (PathArgument *)&(local_20->key_).field_0x1;
      }
      in_stack_fffffffffffffef8 = (const_iterator *)&local_c1;
      in_stack_fffffffffffffee0 = in_RDI;
      pPVar4 = local_78;
      in_stack_fffffffffffffef0 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 (char *)in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0,
                 (allocator<char> *)pPVar4);
      PathArgument::PathArgument(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)
                 in_stack_fffffffffffffee0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      PathArgument::~PathArgument((PathArgument *)0x187baf);
      std::__cxx11::string::~string((string *)((long)&local_c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return;
}

Assistant:

void Path::makePath(const std::string& path, const InArgs& in) {
  const char* current = path.c_str();
  const char* end = current + path.length();
  InArgs::const_iterator itInArg = in.begin();
  while (current != end) {
    if (*current == '[') {
      ++current;
      if (*current == '%')
        addPathInArg(path, in, itInArg, PathArgument::kindIndex);
      else {
        ArrayIndex index = 0;
        for (; current != end && *current >= '0' && *current <= '9'; ++current)
          index = index * 10 + ArrayIndex(*current - '0');
        args_.push_back(index);
      }
      if (current == end || *current++ != ']')
        invalidPath(path, int(current - path.c_str()));
    } else if (*current == '%') {
      addPathInArg(path, in, itInArg, PathArgument::kindKey);
      ++current;
    } else if (*current == '.') {
      ++current;
    } else {
      const char* beginName = current;
      while (current != end && !strchr("[.", *current))
        ++current;
      args_.push_back(std::string(beginName, current));
    }
  }
}